

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

void cram_free_compression_header(cram_block_compression_hdr *hdr)

{
  kh_map_t *__ptr;
  cram_codec *pcVar1;
  cram_map *pcVar2;
  kh_m_s2i_t *__ptr_00;
  cram_map *pcVar3;
  long lVar4;
  
  if (hdr->landmark != (int32_t *)0x0) {
    free(hdr->landmark);
  }
  __ptr = hdr->preservation_map;
  if (__ptr != (kh_map_t *)0x0) {
    free(__ptr->keys);
    free(__ptr->flags);
    free(__ptr->vals);
    free(__ptr);
  }
  lVar4 = 0;
  do {
    pcVar3 = hdr->rec_encoding_map[lVar4];
    while (pcVar3 != (cram_map *)0x0) {
      pcVar1 = pcVar3->codec;
      pcVar2 = pcVar3->next;
      if (pcVar1 != (cram_codec *)0x0) {
        (*pcVar1->free)(pcVar1);
      }
      free(pcVar3);
      pcVar3 = pcVar2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  lVar4 = 0;
  do {
    pcVar3 = hdr->tag_encoding_map[lVar4];
    while (pcVar3 != (cram_map *)0x0) {
      pcVar1 = pcVar3->codec;
      pcVar2 = pcVar3->next;
      if (pcVar1 != (cram_codec *)0x0) {
        (*pcVar1->free)(pcVar1);
      }
      free(pcVar3);
      pcVar3 = pcVar2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  lVar4 = 0x50;
  do {
    if (*(long *)(hdr->substitution_matrix + lVar4 * 2 + -0xe) != 0) {
      (**(code **)(*(long *)(hdr->substitution_matrix + lVar4 * 2 + -0xe) + 0x10))();
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x7f);
  if (hdr->TL != (uchar **)0x0) {
    free(hdr->TL);
  }
  if (hdr->TD_blk != (cram_block *)0x0) {
    cram_free_block(hdr->TD_blk);
  }
  __ptr_00 = hdr->TD_hash;
  if (__ptr_00 != (kh_m_s2i_t *)0x0) {
    free(__ptr_00->keys);
    free(__ptr_00->flags);
    free(__ptr_00->vals);
    free(__ptr_00);
  }
  if (hdr->TD_keys != (string_alloc_t *)0x0) {
    string_pool_destroy(hdr->TD_keys);
  }
  free(hdr);
  return;
}

Assistant:

void cram_free_compression_header(cram_block_compression_hdr *hdr) {
    int i;

    if (hdr->landmark)
	free(hdr->landmark);

    if (hdr->preservation_map)
	kh_destroy(map, hdr->preservation_map);

    for (i = 0; i < CRAM_MAP_HASH; i++) {
	cram_map *m, *m2;
	for (m = hdr->rec_encoding_map[i]; m; m = m2) {
	    m2 = m->next;
	    if (m->codec)
		m->codec->free(m->codec);
	    free(m);
	}
    }

    for (i = 0; i < CRAM_MAP_HASH; i++) {
	cram_map *m, *m2;
	for (m = hdr->tag_encoding_map[i]; m; m = m2) {
	    m2 = m->next;
	    if (m->codec)
		m->codec->free(m->codec);
	    free(m);
	}
    }

    for (i = 0; i < DS_END; i++) {
	if (hdr->codecs[i])
	    hdr->codecs[i]->free(hdr->codecs[i]);
    }

    if (hdr->TL)
	free(hdr->TL);
    if (hdr->TD_blk)
	cram_free_block(hdr->TD_blk);
    if (hdr->TD_hash)
	kh_destroy(m_s2i, hdr->TD_hash);
    if (hdr->TD_keys)
	string_pool_destroy(hdr->TD_keys);

    free(hdr);
}